

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Kernel::Kernel(Kernel *this,Kernel *from)

{
  KernelCase KVar1;
  InternalMetadataWithArenaLite *this_00;
  LinearKernel *this_01;
  LinearKernel *from_00;
  RBFKernel *this_02;
  RBFKernel *from_01;
  PolyKernel *this_03;
  PolyKernel *from_02;
  SigmoidKernel *this_04;
  SigmoidKernel *from_03;
  Kernel *from_local;
  Kernel *this_local;
  Container *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Kernel_00d5d2b8;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  KernelUnion::KernelUnion((KernelUnion *)&this->kernel_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,&local_20->unknown_fields);
  }
  clear_has_kernel(this);
  KVar1 = kernel_case(from);
  switch(KVar1) {
  case KERNEL_NOT_SET:
    break;
  case kLinearKernel:
    this_01 = mutable_linearkernel(this);
    from_00 = linearkernel(from);
    LinearKernel::MergeFrom(this_01,from_00);
    break;
  case kRbfKernel:
    this_02 = mutable_rbfkernel(this);
    from_01 = rbfkernel(from);
    RBFKernel::MergeFrom(this_02,from_01);
    break;
  case kPolyKernel:
    this_03 = mutable_polykernel(this);
    from_02 = polykernel(from);
    PolyKernel::MergeFrom(this_03,from_02);
    break;
  case kSigmoidKernel:
    this_04 = mutable_sigmoidkernel(this);
    from_03 = sigmoidkernel(from);
    SigmoidKernel::MergeFrom(this_04,from_03);
  }
  return;
}

Assistant:

Kernel::Kernel(const Kernel& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  clear_has_kernel();
  switch (from.kernel_case()) {
    case kLinearKernel: {
      mutable_linearkernel()->::CoreML::Specification::LinearKernel::MergeFrom(from.linearkernel());
      break;
    }
    case kRbfKernel: {
      mutable_rbfkernel()->::CoreML::Specification::RBFKernel::MergeFrom(from.rbfkernel());
      break;
    }
    case kPolyKernel: {
      mutable_polykernel()->::CoreML::Specification::PolyKernel::MergeFrom(from.polykernel());
      break;
    }
    case kSigmoidKernel: {
      mutable_sigmoidkernel()->::CoreML::Specification::SigmoidKernel::MergeFrom(from.sigmoidkernel());
      break;
    }
    case KERNEL_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Kernel)
}